

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void OpenURL(char *url)

{
  char *pcVar1;
  size_t sVar2;
  char *cmd;
  char *url_local;
  
  pcVar1 = strchr(url,0x27);
  if (pcVar1 == (char *)0x0) {
    sVar2 = strlen(url);
    pcVar1 = (char *)calloc(sVar2 + 10,1);
    sprintf(pcVar1,"xdg-open \'%s\'",url);
    system(pcVar1);
    free(pcVar1);
  }
  else {
    TraceLog(4,"SYSTEM: Provided URL is not valid");
  }
  return;
}

Assistant:

void OpenURL(const char *url)
{
    // Small security check trying to avoid (partially) malicious code...
    // sorry for the inconvenience when you hit this point...
    if (strchr(url, '\'') != NULL)
    {
        TRACELOG(LOG_WARNING, "SYSTEM: Provided URL is not valid");
    }
    else
    {
#if defined(PLATFORM_DESKTOP)
        char *cmd = (char *)RL_CALLOC(strlen(url) + 10, sizeof(char));
    #if defined(_WIN32)
        sprintf(cmd, "explorer %s", url);
    #endif
    #if defined(__linux__) || defined(__FreeBSD__)
        sprintf(cmd, "xdg-open '%s'", url); // Alternatives: firefox, x-www-browser
    #endif
    #if defined(__APPLE__)
        sprintf(cmd, "open '%s'", url);
    #endif
        system(cmd);
        RL_FREE(cmd);
#endif
#if defined(PLATFORM_WEB)
        emscripten_run_script(TextFormat("window.open('%s', '_blank')", url));
#endif
    }
}